

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

void deepFreeData(Data data)

{
  DataType DVar1;
  DataType t;
  Data data_local;
  
  DVar1 = data->type;
  if (DVar1 == StringType) {
    freeString((data->val).s);
  }
  if (DVar1 == ObjectType) {
    freeObject((data->val).o);
  }
  if (DVar1 == ArrayType) {
    freeArray((data->val).a);
  }
  free(data);
  return;
}

Assistant:

void deepFreeData(Data data) {
    DataType t = data->type;
    if (t == StringType)
        freeString(data->val.s);
    if (t == ObjectType)
        freeObject(data->val.o);
    if (t == ArrayType)
        freeArray(data->val.a);
    free(data);
}